

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O1

char * wc_error(int value)

{
  int iVar1;
  
  iVar1 = -value;
  if (0 < value) {
    iVar1 = value;
  }
  if (iVar1 - 1U < 3) {
    return &DAT_0017a790 + *(int *)(&DAT_0017a790 + (ulong)(iVar1 - 1U) * 4);
  }
  return "INTERNAL ERROR: unrecognised wildcard error number";
}

Assistant:

const char *wc_error(int value)
{
    value = abs(value);
    switch (value) {
      case WC_TRAILINGBACKSLASH:
        return "'\' occurred at end of string (expected another character)";
      case WC_UNCLOSEDCLASS:
        return "expected ']' to close character class";
      case WC_INVALIDRANGE:
        return "character range was not terminated (']' just after '-')";
    }
    return "INTERNAL ERROR: unrecognised wildcard error number";
}